

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::delay_allowed
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vloc_t *vloc)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  size_t i;
  ulong uVar4;
  allocator<unsigned_long> local_31;
  
  uVar1 = (vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>._capacity
  ;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)r->_refcount,0,&local_31);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(__return_storage_ptr__);
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      return __return_storage_ptr__;
    }
    puVar3 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                       (&vloc->super_loc_array_t,(capacity_t)uVar4);
    bVar2 = system_t::is_urgent(system,*puVar3);
    if (bVar2) {
LAB_0016a0e0:
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (__return_storage_ptr__,
                 (ulong)(r->_procmap).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
    }
    else {
      puVar3 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                         (&vloc->super_loc_array_t,(capacity_t)uVar4);
      bVar2 = syncprod::system_t::is_committed(&system->super_system_t,*puVar3);
      if (bVar2) goto LAB_0016a0e0;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

boost::dynamic_bitset<> delay_allowed(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                      tchecker::vloc_t const & vloc)
{
  std::size_t const size = vloc.size();
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> allowed{r.refcount()};
  allowed.set();
  for (std::size_t i = 0; i < size; ++i)
    if (system.is_urgent(vloc[i]) || system.is_committed(vloc[i]))
      allowed.reset(procmap[i]);
  return allowed;
}